

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

_Bool duckdb_je_background_thread_boot0(void)

{
  if ((duckdb_je_opt_background_thread) &&
     (pthread_create_fptr ==
      (_func_int_pthread_t_ptr_pthread_attr_t_ptr__func_void_ptr_void_ptr_ptr_void_ptr *)0x0)) {
    pthread_create_fptr = pthread_create;
  }
  return false;
}

Assistant:

bool
background_thread_boot0(void) {
	if (!have_background_thread && opt_background_thread) {
		malloc_printf("<jemalloc>: option background_thread currently "
		    "supports pthread only\n");
		return true;
	}
#ifdef JEMALLOC_PTHREAD_CREATE_WRAPPER
	if ((config_lazy_lock || opt_background_thread) &&
	    pthread_create_fptr_init()) {
		return true;
	}
#endif
	return false;
}